

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall DEndGameMenu::HandleResult(DEndGameMenu *this,bool res)

{
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,res) == 0) {
    (*(this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject[0xd])();
    DMessageBoxMenu::CloseSound(&this->super_DMessageBoxMenu);
    return;
  }
  M_ClearMenus();
  if (netgame != false) {
    return;
  }
  D_StartTitle();
  return;
}

Assistant:

void DEndGameMenu::HandleResult(bool res)
{
	if (res)
	{
		M_ClearMenus ();
		if (!netgame)
		{
			D_StartTitle ();
		}
	}
	else
	{
		Close();
		CloseSound();
	}
}